

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfe.cpp
# Opt level: O1

string * to_string_abi_cxx11_(string *__return_storage_ptr__,TrackEncoding track_encoding)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(track_encoding) {
  case ISOIBM_MFM_ENCODING:
    pcVar2 = "ISOIBM_MFM_ENCODING";
    pcVar1 = "";
    break;
  case AMIGA_MFM_ENCODING:
    pcVar2 = "AMIGA_MFM_ENCODING";
    pcVar1 = "";
    break;
  case ISOIBM_FM_ENCODING:
    pcVar2 = "ISOIBM_FM_ENCODING";
    pcVar1 = "";
    break;
  case EMU_FM_ENCODING:
    pcVar2 = "EMU_FM_ENCODING";
    pcVar1 = "";
    break;
  default:
    if (track_encoding == UNKNOWN_ENCODING) {
      pcVar2 = "UNKNOWN_ENCODING";
      pcVar1 = "";
    }
    else {
      pcVar2 = "Unknown";
      pcVar1 = "";
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(TrackEncoding track_encoding)
{
    switch (track_encoding)
    {
    case ISOIBM_MFM_ENCODING:   return "ISOIBM_MFM_ENCODING";   break;
    case AMIGA_MFM_ENCODING:    return "AMIGA_MFM_ENCODING";    break;
    case ISOIBM_FM_ENCODING:    return "ISOIBM_FM_ENCODING";    break;
    case EMU_FM_ENCODING:       return "EMU_FM_ENCODING";       break;
    case UNKNOWN_ENCODING:      return "UNKNOWN_ENCODING";      break;
    }
    return "Unknown";
}